

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::StructBuilderBody
          (PythonGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr,
          size_t index,bool in_array)

{
  StructDef *pSVar1;
  bool bVar2;
  reference ppFVar3;
  char *pcVar4;
  string local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  ulong local_450;
  size_t i;
  size_t array_cnt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  undefined1 local_280 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> index_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  Type local_180;
  Type *local_160;
  Type *type;
  Type *field_type;
  FieldDef *field;
  undefined1 local_140 [8];
  const_reverse_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string indent;
  string *code;
  bool in_array_local;
  size_t index_local;
  string *code_ptr_local;
  char *nameprefix_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  indent.field_2._8_8_ = code_ptr;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,index << 2,' ',&local_61);
  std::allocator<char>::~allocator(&local_61);
  std::operator+(&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 "    builder.Prep(");
  NumToString<unsigned_long>(&local_f8,struct_def->minalign);
  std::operator+(&local_b8,&local_d8,&local_f8);
  std::operator+(&local_98,&local_b8,", ");
  std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  NumToString<unsigned_long>((string *)&it,struct_def->bytesize);
  std::operator+(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it
                 ,")\n");
  std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&it);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rbegin
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_140)
  ;
  code._7_1_ = in_array;
  while( true ) {
    std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rend
              ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&field);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)local_140,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)&field);
    if (!bVar2) break;
    ppFVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                           *)local_140);
    field_type = (Type *)*ppFVar3;
    type = &(((FieldDef *)field_type)->value).type;
    bVar2 = IsArray(type);
    if (bVar2) {
      Type::VectorType(&local_180,type);
    }
    else {
      local_180.base_type = type->base_type;
      local_180.element = type->element;
      local_180.struct_def = type->struct_def;
      local_180.enum_def = type->enum_def;
      local_180.fixed_length = type->fixed_length;
    }
    local_160 = &local_180;
    if (field_type[9].struct_def != (StructDef *)0x0) {
      std::operator+(&local_1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "    builder.Pad(");
      NumToString<unsigned_long>(&local_200,(unsigned_long)field_type[9].struct_def);
      std::operator+(&local_1c0,&local_1e0,&local_200);
      std::operator+(&local_1a0,&local_1c0,")\n");
      std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    bVar2 = IsStruct(type);
    if (bVar2) {
      pSVar1 = type->struct_def;
      IdlNamer::Field_abi_cxx11_
                ((string *)((long)&index_var.field_2 + 8),&this->namer_,(FieldDef *)field_type);
      std::operator+(&local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&index_var.field_2 + 8),"_");
      std::operator+(&local_220,nameprefix,&local_240);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      StructBuilderBody(this,pSVar1,pcVar4,code_ptr,index,(bool)(code._7_1_ & 1));
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)(index_var.field_2._M_local_buf + 8));
    }
    else {
      NumToString<unsigned_long>(&local_2a0,index);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     "_idx",&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      bVar2 = IsArray(type);
      if (bVar2) {
        std::operator+(&local_300,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,"    for ");
        std::operator+(&local_2e0,&local_300,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_280);
        std::operator+(&local_2c0,&local_2e0," in range(");
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_300);
        NumToString<unsigned_short>(&local_320,type->fixed_length);
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_," , 0, -1):\n");
        code._7_1_ = 1;
      }
      bVar2 = IsStruct(local_160);
      if (bVar2) {
        pSVar1 = type->struct_def;
        IdlNamer::Field_abi_cxx11_(&local_380,&this->namer_,(FieldDef *)field_type);
        std::operator+(&local_360,&local_380,"_");
        std::operator+(&local_340,nameprefix,&local_360);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        StructBuilderBody(this,pSVar1,pcVar4,code_ptr,index + 1,(bool)(code._7_1_ & 1));
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::string::~string((string *)&local_380);
      }
      else {
        bVar2 = IsArray(type);
        pcVar4 = "";
        if (bVar2) {
          pcVar4 = "    ";
        }
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,pcVar4);
        std::operator+(&local_3e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,"    builder.Prepend");
        GenMethod_abi_cxx11_(&local_400,this,(FieldDef *)field_type);
        std::operator+(&local_3c0,&local_3e0,&local_400);
        std::operator+(&local_3a0,&local_3c0,"(");
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_400);
        std::__cxx11::string::~string((string *)&local_3e0);
        IdlNamer::Variable_abi_cxx11_((string *)&array_cnt,&this->namer_,(FieldDef *)field_type);
        std::operator+(&local_420,nameprefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &array_cnt);
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_420);
        std::__cxx11::string::~string((string *)&local_420);
        std::__cxx11::string::~string((string *)&array_cnt);
        bVar2 = IsArray(type);
        i = index + (long)(int)(uint)bVar2;
        for (local_450 = 0; (code._7_1_ & 1) != 0 && local_450 < i; local_450 = local_450 + 1) {
          NumToString<unsigned_long>(&local_4b0,local_450);
          std::operator+(&local_490,"[_idx",&local_4b0);
          std::operator+(&local_470,&local_490,"-1]");
          std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_470);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_490);
          std::__cxx11::string::~string((string *)&local_4b0);
        }
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,")\n");
      }
      std::__cxx11::string::~string((string *)local_280);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                  *)local_140);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void StructBuilderBody(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr, size_t index = 0,
                         bool in_array = false) const {
    auto &code = *code_ptr;
    std::string indent(index * 4, ' ');
    code +=
        indent + "    builder.Prep(" + NumToString(struct_def.minalign) + ", ";
    code += NumToString(struct_def.bytesize) + ")\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      const auto &type =
          IsArray(field_type) ? field_type.VectorType() : field_type;
      if (field.padding)
        code +=
            indent + "    builder.Pad(" + NumToString(field.padding) + ")\n";
      if (IsStruct(field_type)) {
        StructBuilderBody(*field_type.struct_def,
                          (nameprefix + (namer_.Field(field) + "_")).c_str(),
                          code_ptr, index, in_array);
      } else {
        const auto index_var = "_idx" + NumToString(index);
        if (IsArray(field_type)) {
          code += indent + "    for " + index_var + " in range(";
          code += NumToString(field_type.fixed_length);
          code += " , 0, -1):\n";
          in_array = true;
        }
        if (IsStruct(type)) {
          StructBuilderBody(*field_type.struct_def,
                            (nameprefix + (namer_.Field(field) + "_")).c_str(),
                            code_ptr, index + 1, in_array);
        } else {
          code += IsArray(field_type) ? "    " : "";
          code += indent + "    builder.Prepend" + GenMethod(field) + "(";
          code += nameprefix + namer_.Variable(field);
          size_t array_cnt = index + (IsArray(field_type) ? 1 : 0);
          for (size_t i = 0; in_array && i < array_cnt; i++) {
            code += "[_idx" + NumToString(i) + "-1]";
          }
          code += ")\n";
        }
      }
    }
  }